

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void call_init_write_memory(qpdf_data qpdf)

{
  element_type *this;
  shared_ptr<QPDFWriter> local_20;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)qpdf);
  std::make_shared<QPDFWriter,QPDF&>((QPDF *)&local_20);
  std::shared_ptr<QPDFWriter>::operator=(&local_10->qpdf_writer,&local_20);
  std::shared_ptr<QPDFWriter>::~shared_ptr(&local_20);
  this = std::__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<QPDFWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &local_10->qpdf_writer);
  QPDFWriter::setOutputMemory(this);
  return;
}

Assistant:

static void
call_init_write_memory(qpdf_data qpdf)
{
    qpdf->qpdf_writer = std::make_shared<QPDFWriter>(*(qpdf->qpdf));
    qpdf->qpdf_writer->setOutputMemory();
}